

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  byte *pbVar1;
  int rv;
  uint8_t b_local;
  nghttp2_bufs *bufs_local;
  
  bufs_local._4_4_ = bufs_ensure_addb(bufs);
  if (bufs_local._4_4_ == 0) {
    pbVar1 = (bufs->cur->buf).last;
    *pbVar1 = *pbVar1 | b;
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_bufs_orb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

  *bufs->cur->buf.last |= b;

  return 0;
}